

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::SeverityTask::SeverityTask
          (SeverityTask *this,KnownSystemName knownNameId,ElabSystemTaskKind taskKind)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005f46e8;
  this->taskKind = taskKind;
  return;
}

Assistant:

SeverityTask(KnownSystemName knownNameId, ElabSystemTaskKind taskKind) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), taskKind(taskKind) {}